

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

FrameDisplay * __thiscall
Js::InterpreterStackFrame::OP_LdFrameDisplay
          (InterpreterStackFrame *this,void *argHead,void *argEnv,ScriptContext *scriptContext)

{
  bool bVar1;
  FrameDisplay *pFStack_30;
  bool strict;
  FrameDisplay *frameDisplay;
  ScriptContext *scriptContext_local;
  void *argEnv_local;
  void *argHead_local;
  InterpreterStackFrame *this_local;
  
  bVar1 = ParseableFunctionInfo::GetIsStrictMode(*(ParseableFunctionInfo **)(this + 0x88));
  if (bVar1) {
    pFStack_30 = Js::JavascriptOperators::OP_LdStrictFrameDisplay(argHead,argEnv,scriptContext);
  }
  else {
    pFStack_30 = Js::JavascriptOperators::OP_LdFrameDisplay(argHead,argEnv,scriptContext);
  }
  return pFStack_30;
}

Assistant:

FrameDisplay *
        InterpreterStackFrame::OP_LdFrameDisplay(void *argHead, void *argEnv, ScriptContext *scriptContext)
    {
        FrameDisplay *frameDisplay;
        bool strict = this->m_functionBody->GetIsStrictMode();
        if (strict)
        {
            frameDisplay = JavascriptOperators::OP_LdStrictFrameDisplay(argHead, argEnv, scriptContext);
        }
        else
        {
            frameDisplay = JavascriptOperators::OP_LdFrameDisplay(argHead, argEnv, scriptContext);
        }
        return frameDisplay;
    }